

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

void __thiscall FSerializer::EndObject(FSerializer *this)

{
  FWriter *this_00;
  TArray<FJSONObject,_FJSONObject> *pTVar1;
  uint uVar2;
  
  this_00 = this->w;
  if (this_00 == (FWriter *)0x0) {
    uVar2 = (this->r->mObjects).Count;
    if (uVar2 == 0) {
      return;
    }
    pTVar1 = &this->r->mObjects;
  }
  else {
    uVar2 = (this_00->mInObject).Count;
    if ((uVar2 == 0) || ((this_00->mInObject).Array[uVar2 - 1] != true)) {
      __assert_fail("false && \"EndObject call not inside an object\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                    ,0x26e,"void FSerializer::EndObject()");
    }
    FWriter::EndObject(this_00);
    uVar2 = (this->w->mInObject).Count;
    if (uVar2 == 0) {
      return;
    }
    pTVar1 = (TArray<FJSONObject,_FJSONObject> *)&this->w->mInObject;
  }
  pTVar1->Count = uVar2 - 1;
  return;
}

Assistant:

void FSerializer::EndObject()
{
	if (isWriting())
	{
		if (w->inObject())
		{
			w->EndObject();
			w->mInObject.Pop();
		}
		else
		{
			assert(false && "EndObject call not inside an object");
			I_Error("EndObject call not inside an object");
		}
	}
	else
	{
		r->mObjects.Pop();
	}
}